

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

bool Cipher::refineNearby(TParameters *params,TFreqMap *freqMap,TResult *result)

{
  value_type vVar1;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  mapped_type *this;
  reference pvVar7;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __last;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  int idx1;
  int idx0;
  int k;
  THypothesis hnew;
  int i_1;
  bool converged;
  THypothesis hbest;
  int i;
  THypothesis hcur;
  int N;
  undefined4 in_stack_fffffffffffffd68;
  TProb in_stack_fffffffffffffd6c;
  THypothesis *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  THypothesis *in_stack_fffffffffffffd88;
  THypothesis *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffda0;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4 [2];
  TProb local_1ec;
  char local_1e6;
  char local_1e5;
  int local_1e4;
  TProb local_1e0;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe60;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe68;
  TFreqMap *in_stack_fffffffffffffe70;
  TParameters *in_stack_fffffffffffffe78;
  int local_178;
  float local_170;
  int local_100;
  vector<int,_std::allocator<int>_> local_50 [2];
  int local_1c;
  long local_18;
  int *local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDX + 0x40));
  local_1c = (int)sVar4;
  refineNearby::THypothesis::THypothesis(in_stack_fffffffffffffd70);
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             in_stack_fffffffffffffd70,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x14f4a3);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x14f4c9);
  refineNearby::THypothesis::operator=
            (in_stack_fffffffffffffd70,
             (THypothesis *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  refineNearby::THypothesis::~THypothesis(in_stack_fffffffffffffd70);
  translate((TClusterToLetterMap *)in_stack_fffffffffffffd90,(TClusters *)in_stack_fffffffffffffd88,
            (vector<int,_std::allocator<int>_> *)
            CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  for (local_100 = 0;
      sVar4 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(local_8 + 0x28)),
      local_100 < (int)sVar4; local_100 = local_100 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_8 + 0x28),(long)local_100);
    if (*pvVar5 != -1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_8 + 0x28),(long)local_100);
      vVar1 = *pvVar5;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_100);
      *pvVar6 = vVar1;
    }
  }
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_fffffffffffffda0,CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
             ,&in_stack_fffffffffffffd90->p);
  calcScore(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
            in_stack_fffffffffffffe60);
  refineNearby::THypothesis::THypothesis(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  do {
    bVar2 = true;
    refineNearby::THypothesis::operator=
              (in_stack_fffffffffffffd70,
               (THypothesis *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    for (local_178 = 0; local_178 < local_1c; local_178 = local_178 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_178);
      if ((0 < *pvVar6) &&
         (pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_178),
         *pvVar6 < 0x1b)) {
        refineNearby::THypothesis::THypothesis(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        local_1e4 = 1;
        while( true ) {
          iVar3 = local_1e4;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_178);
          local_1e5 = (char)*pvVar6 + '`';
          this = std::
                 map<char,_std::vector<char,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<char,_std::allocator<char>_>_>_>_>
                 ::at((map<char,_std::vector<char,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<char,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffd90,(key_type_conflict *)in_stack_fffffffffffffd88);
          sVar4 = std::vector<char,_std::allocator<char>_>::size(this);
          if ((int)sVar4 <= iVar3) break;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_50,(long)local_178);
          local_1e6 = (char)*pvVar6 + '`';
          in_stack_fffffffffffffd90 =
               (THypothesis *)
               std::
               map<char,_std::vector<char,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::at((map<char,_std::vector<char,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<char,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffffd90,(key_type_conflict *)in_stack_fffffffffffffd88);
          pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd90,
                              (long)local_1e4);
          iVar3 = *pvVar7 + -0x60;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffe58,
                              (long)local_178);
          *pvVar6 = iVar3;
          local_1f4[1] = 0;
          local_1f4[0] = (local_178 - *local_10) + 1;
          in_stack_fffffffffffffd88 = (THypothesis *)std::max<int>(local_1f4 + 1,local_1f4);
          local_1ec = in_stack_fffffffffffffd88->p;
          local_1fc = local_1c + -1;
          local_200 = local_178 + -1 + *local_10;
          __last._M_current = (float *)std::min<int>(&local_1fc,&local_200);
          local_1f8 = *(int *)&((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                 *)__last._M_current)->_M_current;
          in_stack_fffffffffffffd70 = (THypothesis *)&stack0xfffffffffffffe70;
          std::vector<float,_std::allocator<float>_>::begin
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
          operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                    __last._M_current,(difference_type)in_stack_fffffffffffffd70);
          std::vector<float,_std::allocator<float>_>::begin
                    ((vector<float,_std::allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
          operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                    __last._M_current,(difference_type)in_stack_fffffffffffffd70);
          __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
          operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                    __last._M_current,(difference_type)in_stack_fffffffffffffd70);
          __first._M_current._4_4_ = iVar3;
          __first._M_current._0_4_ = in_stack_fffffffffffffd80;
          std::
          fill<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                    (__first,__last,(double *)in_stack_fffffffffffffd70);
          in_stack_fffffffffffffd6c =
               calcScore(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                         in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
          local_1e0 = in_stack_fffffffffffffd6c;
          if (local_170 < in_stack_fffffffffffffd6c) {
            refineNearby::THypothesis::operator=
                      (in_stack_fffffffffffffd70,
                       (THypothesis *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68))
            ;
            bVar2 = false;
          }
          local_1e4 = local_1e4 + 1;
        }
        refineNearby::THypothesis::~THypothesis(in_stack_fffffffffffffd70);
      }
    }
  } while (!bVar2);
  printPlain((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd70);
  printf(" [%8.3f %8.3f]",SUB84((double)local_170,0),(double)*(float *)(local_18 + 4));
  refineNearby::THypothesis::~THypothesis(in_stack_fffffffffffffd70);
  refineNearby::THypothesis::~THypothesis(in_stack_fffffffffffffd70);
  return true;
}

Assistant:

bool refineNearby(
        const TParameters & params,
        const TFreqMap & freqMap,
        TResult & result) {

        const int N = result.clusters.size();

        struct THypothesis {
            TProb p;
            TClusterToLetterMap clMap;
            std::vector<TLetter> plain;
            std::vector<TProb> memo;
        };

        {
            THypothesis hcur;
            hcur = { 0.0, result.clMap, {}, {}};
            translate(hcur.clMap, result.clusters, hcur.plain);
            for (int i = 0; i < (int) params.hint.size(); ++i) {
                if (params.hint[i] != -1) {
                    hcur.plain[i] = params.hint[i];
                }
            }
            hcur.memo.resize(N, 1.0);
            hcur.p = calcScore(params, freqMap, hcur.plain, hcur.memo);

            THypothesis hbest = hcur;
            while (true) {
                bool converged = true;

                hcur = hbest;
                for (int i = 0; i < N; ++i) {
                    if (hcur.plain[i] < 1 || hcur.plain[i] > 26) continue;
                    auto hnew = hcur;
                    for (int k = 1; k < (int) kNearbyKeys.at('a' + hcur.plain[i] - 1).size(); ++k) {
                        hnew.plain[i] = kNearbyKeys.at('a' + hcur.plain[i] - 1)[k] - 'a' + 1;
                        const auto idx0 = std::max(0, i - freqMap.len + 1);
                        const auto idx1 = std::min(N - 1, i + freqMap.len - 1);
                        std::fill(hnew.memo.begin() + idx0, hnew.memo.begin() + idx1 + 1, 1.0);
                        hnew.p = calcScore(params, freqMap, hnew.plain, hnew.memo);
                        if (hbest.p < hnew.p) {
                            hbest = hnew;
                            converged = false;
                        }
                    }
                }

                if (converged) break;
            }

            printPlain(hbest.plain);
            printf(" [%8.3f %8.3f]", (double) hbest.p, (double) result.p);
        }

        return true;
    }